

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O3

void fiat_id_tc26_gost_3410_2012_512_paramSetB_add(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  
  uVar4 = *arg2 + *arg1;
  uVar1 = (ulong)CARRY8(*arg2,*arg1);
  uVar8 = arg1[1] + uVar1;
  uVar2 = arg2[2] + arg1[2];
  uVar13 = (ulong)CARRY8(arg2[2],arg1[2]);
  uVar10 = arg2[3] + arg1[3];
  uVar15 = (ulong)CARRY8(arg2[3],arg1[3]);
  uVar5 = arg2[4] + arg1[4];
  uVar17 = (ulong)CARRY8(arg2[4],arg1[4]);
  uVar11 = arg2[5] + arg1[5];
  uVar7 = (ulong)CARRY8(arg2[5],arg1[5]);
  uVar12 = arg2[6] + arg1[6];
  uVar19 = (ulong)CARRY8(arg2[6],arg1[6]);
  uVar20 = arg2[7] + arg1[7];
  uVar9 = uVar8 + arg2[1];
  uVar6 = (ulong)CARRY8(arg1[1],uVar1);
  uVar1 = (ulong)CARRY8(uVar8,arg2[1]);
  uVar8 = uVar2 + uVar6;
  uVar3 = uVar8 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar2,uVar6) || CARRY8(uVar8,uVar1));
  uVar8 = uVar13 + uVar10;
  uVar14 = uVar8 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar13,uVar10) || CARRY8(uVar8,uVar1));
  uVar8 = uVar15 + uVar5;
  uVar16 = uVar8 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar15,uVar5) || CARRY8(uVar8,uVar1));
  uVar8 = uVar17 + uVar11;
  uVar18 = uVar8 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar17,uVar11) || CARRY8(uVar8,uVar1));
  uVar8 = uVar7 + uVar12;
  uVar13 = uVar8 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar7,uVar12) || CARRY8(uVar8,uVar1));
  uVar8 = uVar19 + uVar20;
  uVar15 = uVar8 + uVar1;
  uVar2 = (ulong)(byte)-((0x6e < uVar4) + -1);
  uVar5 = (ulong)(uVar9 < uVar2);
  uVar6 = (ulong)(uVar3 < uVar5);
  uVar10 = (ulong)(uVar14 < uVar6);
  uVar11 = (ulong)(uVar16 < uVar10);
  uVar7 = (ulong)(uVar18 < uVar11);
  uVar12 = (ulong)(uVar13 < uVar7) | 0x8000000000000000;
  uVar1 = -(ulong)((byte)(CARRY8(arg2[7],arg1[7]) + (CARRY8(uVar19,uVar20) || CARRY8(uVar8,uVar1)))
                  < (uVar15 < uVar12));
  uVar8 = ~uVar1;
  *out1 = uVar4 - 0x6f & uVar8 | uVar4 & uVar1;
  out1[1] = uVar9 - uVar2 & uVar8 | uVar9 & uVar1;
  out1[2] = uVar3 - uVar5 & uVar8 | uVar3 & uVar1;
  out1[3] = uVar14 - uVar6 & uVar8 | uVar14 & uVar1;
  out1[4] = uVar16 - uVar10 & uVar8 | uVar16 & uVar1;
  out1[5] = uVar18 - uVar11 & uVar8 | uVar18 & uVar1;
  out1[6] = uVar13 - uVar7 & uVar8 | uVar13 & uVar1;
  out1[7] = uVar8 & uVar15 - uVar12 | uVar1 & uVar15;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetB_add(
    uint64_t out1[8], const uint64_t arg1[8], const uint64_t arg2[8]) {
    uint64_t x1;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x2;
    uint64_t x3;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x4;
    uint64_t x5;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x6;
    uint64_t x7;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x8;
    uint64_t x9;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x10;
    uint64_t x11;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x12;
    uint64_t x13;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x14;
    uint64_t x15;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x16;
    uint64_t x17;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x18;
    uint64_t x19;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x20;
    uint64_t x21;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x22;
    uint64_t x23;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x24;
    uint64_t x25;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x26;
    uint64_t x27;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x28;
    uint64_t x29;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x30;
    uint64_t x31;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x32;
    uint64_t x33;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x34;
    uint64_t x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    uint64_t x40;
    uint64_t x41;
    uint64_t x42;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x1, &x2, 0x0, (arg1[0]), (arg2[0]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x3, &x4, x2, (arg1[1]), (arg2[1]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x5, &x6, x4, (arg1[2]), (arg2[2]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x7, &x8, x6, (arg1[3]), (arg2[3]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x9, &x10, x8, (arg1[4]), (arg2[4]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x11, &x12, x10, (arg1[5]), (arg2[5]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x13, &x14, x12, (arg1[6]), (arg2[6]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x15, &x16, x14, (arg1[7]), (arg2[7]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x17, &x18, 0x0,
                                                             x1, UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x19, &x20, x18,
                                                             x3, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x21, &x22, x20,
                                                             x5, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x23, &x24, x22,
                                                             x7, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x25, &x26, x24,
                                                             x9, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x27, &x28, x26,
                                                             x11, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x29, &x30, x28,
                                                             x13, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(
        &x31, &x32, x30, x15, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x33, &x34, x32,
                                                             x16, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x35, x34, x17, x1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x36, x34, x19, x3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x37, x34, x21, x5);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x38, x34, x23, x7);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x39, x34, x25, x9);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x40, x34, x27, x11);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x41, x34, x29, x13);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x42, x34, x31, x15);
    out1[0] = x35;
    out1[1] = x36;
    out1[2] = x37;
    out1[3] = x38;
    out1[4] = x39;
    out1[5] = x40;
    out1[6] = x41;
    out1[7] = x42;
}